

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::draw_rectangle<unsigned_char>
          (CImg<unsigned_char> *this,int x0,int y0,int z0,int x1,int y1,int z1,uchar *color,
          float opacity)

{
  bool bVar1;
  CImgArgumentException *this_00;
  char *pcVar2;
  int c;
  long lVar3;
  
  bVar1 = is_empty(this);
  if (!bVar1) {
    if (color == (uchar *)0x0) {
      this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
      pcVar2 = "non-";
      if (this->_is_shared != false) {
        pcVar2 = "";
      }
      CImgArgumentException::CImgArgumentException
                (this_00,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::draw_rectangle(): Specified color is (null)."
                 ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                 (ulong)this->_spectrum,this->_data,pcVar2,"unsigned char");
      __cxa_throw(this_00,&CImgArgumentException::typeinfo,std::exception::~exception);
    }
    for (lVar3 = 0; lVar3 < (int)this->_spectrum; lVar3 = lVar3 + 1) {
      draw_rectangle(this,x0,y0,z0,(int)lVar3,x1,y1,z1,(int)lVar3,color[lVar3],opacity);
    }
  }
  return this;
}

Assistant:

CImg<T>& draw_rectangle(const int x0, const int y0, const int z0,
                            const int x1, const int y1, const int z1,
                            const tc *const color, const float opacity=1) {
      if (is_empty()) return *this;
      if (!color)
        throw CImgArgumentException(_cimg_instance
                                    "draw_rectangle(): Specified color is (null).",
                                    cimg_instance);
      cimg_forC(*this,c) draw_rectangle(x0,y0,z0,c,x1,y1,z1,c,(T)color[c],opacity);
      return *this;
    }